

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPortDataTransfer.cpp
# Opt level: O2

int __thiscall CPortDataTransfer::DispatchCommand(CPortDataTransfer *this,int client_fd)

{
  bool bVar1;
  FILE *pFVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ssize_t sVar6;
  time_t tVar7;
  ostream *poVar8;
  undefined8 uVar9;
  int iVar10;
  ulong __n;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  allocator local_108d;
  int local_108c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string ret;
  char buffer [4096];
  
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108c = client_fd;
  std::__cxx11::string::string((string *)buffer,"#",(allocator *)&ret);
  SplitString(&this->m_Msg,&v,(string *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  bVar1 = std::operator==(v.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"SENDLIST");
  if (bVar1) {
    if (v.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) {
      send(local_108c,"\r\n",2,0);
    }
    else {
      send(local_108c,
           v.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
           v.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,0);
    }
    std::__cxx11::string::string((string *)buffer,"226 Directory send OK.\r\n",(allocator *)&ret);
    ControlSockSendMsg(this,(string *)buffer);
    uVar9 = std::__cxx11::string::~string((string *)buffer);
    std::__cxx11::string::~string((string *)&ret);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&v);
    _Unwind_Resume(uVar9);
  }
  bVar1 = std::operator==(v.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"SENDFILE");
  if (bVar1) {
    chdir(v.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    pFVar2 = fopen(v.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,"rb");
    lVar12 = 0;
    fseek(pFVar2,0,2);
    lVar3 = ftell(pFVar2);
    fseek(pFVar2,0,0);
    bzero(buffer,0x1000);
    lVar4 = time((time_t *)0x0);
    lVar11 = 0;
    while( true ) {
      sVar5 = fread(buffer,1,0x1000,pFVar2);
      if ((int)(uint)sVar5 < 1) break;
      __n = (ulong)((uint)sVar5 & 0x7fffffff);
      sVar6 = send(local_108c,buffer,__n,0);
      if (sVar6 < 1) break;
      lVar11 = lVar11 + __n;
      lVar12 = lVar12 + __n;
      tVar7 = time((time_t *)0x0);
      if (lVar4 < tVar7) {
        auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar13._0_8_ = lVar11;
        auVar13._12_4_ = 0x45300000;
        auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar15._0_8_ = lVar12;
        auVar15._12_4_ = 0x45300000;
        printf("%s ,progress: %.1f%% ,speed is: %.1f KB/s\n",
               (((auVar15._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) / (double)lVar3) *
               100.0,((auVar13._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) * 0.0009765625
               ,v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
        lVar11 = 0;
        lVar4 = tVar7;
      }
      bzero(buffer,0x1000);
    }
    fclose(pFVar2);
    poVar8 = std::operator<<((ostream *)&std::cout,"Send file completed.");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::string((string *)&ret,"226 Transfer complete.\r\n",&local_108d);
    ControlSockSendMsg(this,&ret);
  }
  else {
    bVar1 = std::operator==(v.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"RECVFILE");
    iVar10 = 0;
    if (!bVar1) goto LAB_00119c11;
    poVar8 = std::operator<<((ostream *)&std::cout,"Get file ");
    poVar8 = std::operator<<(poVar8,v.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    poVar8 = std::operator<<(poVar8,"  ");
    poVar8 = std::operator<<(poVar8,v.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar8);
    chdir(v.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    pFVar2 = fopen(v.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,"wb");
    bzero(buffer,0x1000);
    lVar3 = 0;
    lVar4 = time((time_t *)0x0);
    while( true ) {
      sVar5 = recv(local_108c,buffer,0x1000,0);
      if ((long)sVar5 < 1) break;
      fwrite(buffer,1,sVar5,pFVar2);
      lVar3 = lVar3 + sVar5;
      tVar7 = time((time_t *)0x0);
      if (lVar4 < tVar7) {
        auVar14._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar14._0_8_ = lVar3;
        auVar14._12_4_ = 0x45300000;
        printf("speed is: %.1f KB/s\n",
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * 0.0009765625);
        lVar3 = 0;
        lVar4 = tVar7;
      }
      bzero(buffer,0x1000);
    }
    fclose(pFVar2);
    poVar8 = std::operator<<((ostream *)&std::cout,"Recv file completed.");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::string((string *)&ret,"226 Transfer complete.\r\n",&local_108d);
    ControlSockSendMsg(this,&ret);
  }
  std::__cxx11::string::~string((string *)&ret);
  iVar10 = 1;
LAB_00119c11:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v);
  return iVar10;
}

Assistant:

int CPortDataTransfer::DispatchCommand(int client_fd) {
    vector<string> v;
    SplitString(m_Msg,v,"#");
    if(v[0] == "SENDLIST"){
        if(!v[1].empty()){
            send(client_fd,v[1].c_str(),v[1].size(),0);
        }
        else{
            send(client_fd,"\r\n",2,0);
        }
        string ret = "226 Directory send OK.\r\n";
        ControlSockSendMsg(ret);
    }
    else if(v[0] == "SENDFILE"){
        //cout << "Get file " << v[1].c_str() << "  " <<  v[2].c_str() << endl;

        chdir(v[1].c_str());
        FILE *file = fopen(v[2].c_str(),"rb");
        fseek(file,0,2);
        long size = ftell(file);
        fseek(file,0,0);
        int n = 0;
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        time_t current_time,pre_time;
        pre_time= time(NULL);
        unsigned long sum_sec = 0;
        unsigned long sum = 0;
        while((n = fread(buffer,1,BUFFER_SIZE,file)) > 0){
            if(send(client_fd,buffer,n,0) <= 0)
                break;
            sum_sec += n;
            sum += n;
            current_time = time(NULL);
            if(current_time - pre_time >= 1){
                pre_time = current_time;
                double speed = (sum_sec * 1.0) / 1024;
                double progress = sum * 1.0 / size * 100;
                printf("%s ,progress: %.1f%% ,speed is: %.1f KB/s\n",v[2].c_str(),progress,speed);
                sum_sec = 0;
            }
            bzero(buffer,BUFFER_SIZE);
        }
        fclose(file);
        cout << "Send file completed." << endl;
        string ret = "226 Transfer complete.\r\n";
        ControlSockSendMsg(ret);
        return 1;
    }
    else if(v[0] == "RECVFILE"){
        cout << "Get file " << v[1].c_str() << "  " <<  v[2].c_str() << endl;
        chdir(v[1].c_str());
        FILE *file = fopen(v[2].c_str(),"wb");
        ssize_t n = 0;
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        time_t current_time,pre_time;
        pre_time = time(NULL);
        unsigned long sum_sec = 0;
        unsigned sum = 0;
        while((n = recv(client_fd,buffer,BUFFER_SIZE,0)) > 0){
            fwrite(buffer,1,n,file);
            sum_sec += n;
            current_time = time(NULL);
            if(current_time - pre_time >= 1){
                pre_time = current_time;
                double speed = (sum_sec  * 1.0) / 1024;
                printf("speed is: %.1f KB/s\n",speed);
                sum_sec = 0;
            }
            bzero(buffer,BUFFER_SIZE);
        }
        fclose(file);
        cout << "Recv file completed." << endl;
        string ret = "226 Transfer complete.\r\n";
        ControlSockSendMsg(ret);
        return 1;
    }
    else{
        return 0;
    }
}